

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testCTestResourceAllocator.cxx
# Opt level: O0

bool testResourceFree(void)

{
  uint uVar1;
  Resource local_24;
  Resource r3;
  Resource r2;
  Resource r1;
  bool retval;
  
  r2.Total = 5;
  r2.Locked = 0;
  uVar1 = cmCTestResourceAllocator::Resource::Free(&r2);
  if (uVar1 != 5) {
    std::operator<<((ostream *)&std::cout,
                    "cmCTestResourceAllocator::Resource::Free() did not return expected value for { 5, 0 }\n"
                   );
  }
  r1.Total._3_1_ = uVar1 == 5;
  r3.Total = 3;
  r3.Locked = 2;
  uVar1 = cmCTestResourceAllocator::Resource::Free(&r3);
  if (uVar1 != 1) {
    std::operator<<((ostream *)&std::cout,
                    "cmCTestResourceAllocator::Resource::Free() did not return expected value for { 3, 2 }\n"
                   );
    r1.Total._3_1_ = false;
  }
  local_24.Total = 4;
  local_24.Locked = 4;
  uVar1 = cmCTestResourceAllocator::Resource::Free(&local_24);
  if (uVar1 != 0) {
    std::operator<<((ostream *)&std::cout,
                    "cmCTestResourceAllocator::Resource::Free() did not return expected value for { 4, 4 }\n"
                   );
    r1.Total._3_1_ = false;
  }
  return r1.Total._3_1_;
}

Assistant:

static bool testResourceFree()
{
  bool retval = true;

  const cmCTestResourceAllocator::Resource r1{ 5, 0 };
  if (r1.Free() != 5) {
    std::cout << "cmCTestResourceAllocator::Resource::Free() did not return "
                 "expected value for { 5, 0 }\n";
    retval = false;
  }

  const cmCTestResourceAllocator::Resource r2{ 3, 2 };
  if (r2.Free() != 1) {
    std::cout << "cmCTestResourceAllocator::Resource::Free() did not return "
                 "expected value for { 3, 2 }\n";
    retval = false;
  }

  const cmCTestResourceAllocator::Resource r3{ 4, 4 };
  if (r3.Free() != 0) {
    std::cout << "cmCTestResourceAllocator::Resource::Free() did not return "
                 "expected value for { 4, 4 }\n";
    retval = false;
  }

  return retval;
}